

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWInstanceBase.h
# Opt level: O0

void __thiscall
COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>::~InstanceBase
          (InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> *this)

{
  ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437> *in_RDI;
  
  (in_RDI->super_Object)._vptr_Object = (_func_int **)&PTR__InstanceBase_00e6b878;
  UniqueId::~UniqueId((UniqueId *)(in_RDI + 2));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>::~ObjectTemplate(in_RDI);
  return;
}

Assistant:

virtual ~InstanceBase() {}